

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_lore_friends_base(parser *p)

{
  _Bool _Var1;
  parser_error pVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  undefined8 *puVar6;
  char *pcVar7;
  monster_base *pmVar8;
  undefined4 uVar9;
  random_conflict rVar10;
  
  pvVar5 = parser_priv(p);
  pVar2 = PARSE_ERROR_NONE;
  if (pvVar5 != (void *)0x0) {
    puVar6 = (undefined8 *)mem_zalloc(0x20);
    rVar10 = parser_getrand(p,"number");
    *(wchar_t *)(puVar6 + 3) = rVar10.dice;
    *(wchar_t *)((long)puVar6 + 0x1c) = rVar10.sides;
    uVar3 = parser_getuint(p,"chance");
    *(uint *)((long)puVar6 + 0x14) = uVar3;
    pcVar7 = parser_getsym(p,"name");
    pmVar8 = lookup_monster_base(pcVar7);
    puVar6[1] = pmVar8;
    if (pmVar8 == (monster_base *)0x0) {
      pVar2 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      _Var1 = parser_hasval(p,"role");
      uVar9 = 3;
      if (_Var1) {
        pcVar7 = parser_getsym(p,"role");
        iVar4 = strcmp(pcVar7,"servant");
        if (iVar4 == 0) {
          uVar9 = 1;
        }
        else {
          iVar4 = strcmp(pcVar7,"bodyguard");
          if (iVar4 != 0) {
            return PARSE_ERROR_INVALID_MONSTER_ROLE;
          }
          uVar9 = 2;
        }
      }
      *(undefined4 *)(puVar6 + 2) = uVar9;
      *puVar6 = *(undefined8 *)((long)pvVar5 + 0x50);
      *(undefined8 **)((long)pvVar5 + 0x50) = puVar6;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_lore_friends_base(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_friends_base *f;
	struct random number;

	if (!l)
		return PARSE_ERROR_NONE;
	f = mem_zalloc(sizeof *f);
	number = parser_getrand(p, "number");
	f->number_dice = number.dice;
	f->number_side = number.sides;
	f->percent_chance = parser_getuint(p, "chance");
	f->base = lookup_monster_base(parser_getsym(p, "name"));
	if (!f->base) return PARSE_ERROR_UNRECOGNISED_TVAL;
	if (parser_hasval(p, "role")) {
		const char *role_name = parser_getsym(p, "role");
		if (streq(role_name, "servant")) {
			f->role = MON_GROUP_SERVANT;
		} else if (streq(role_name, "bodyguard")) {
			f->role = MON_GROUP_BODYGUARD;
		} else {
			return PARSE_ERROR_INVALID_MONSTER_ROLE;
		}
	} else {
		f->role = MON_GROUP_MEMBER;
	}

	f->next = l->friends_base;
	l->friends_base = f;

	return PARSE_ERROR_NONE;
}